

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::FeedbackResourceListTestCase::iterate
          (FeedbackResourceListTestCase *this)

{
  Program *programDefinition;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  TestLog *pTVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  size_type sVar7;
  MessageBuilder *pMVar8;
  const_reference value;
  undefined4 extraout_var;
  ProgramInterface interface;
  string *description;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  undefined1 local_3d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedResources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resourceList;
  string local_398;
  allocator<char> local_371;
  string local_370;
  ScopedLogSection local_350;
  ScopedLogSection section;
  undefined1 local_340 [4];
  int ndx;
  MessageBuilder builder;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  FeedbackResourceListTestCase *this_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)this;
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_ResourceListTestCase).super_TestCase.m_context);
  generateProgramInterfaceProgramSources
            (&local_1b0,(this->super_ResourceListTestCase).m_programDefinition);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,pRVar4,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  tcu::TestContext::setTestResult
            ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::MessageBuilder::MessageBuilder((MessageBuilder *)local_340,pTVar5);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_340,(char (*) [31])"Transform feedback varyings: {");
  section.m_log._4_4_ = 0;
  while( true ) {
    iVar2 = section.m_log._4_4_;
    pvVar6 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                       ((this->super_ResourceListTestCase).m_programDefinition);
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar6);
    if ((int)sVar7 <= iVar2) break;
    if (section.m_log._4_4_ != 0) {
      tcu::MessageBuilder::operator<<((MessageBuilder *)local_340,(char (*) [3])0x2a4b1eb);
    }
    pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_340,(char (*) [2])0x2b4bc5e);
    pvVar6 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                       ((this->super_ResourceListTestCase).m_programDefinition);
    value = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](pvVar6,(long)section.m_log._4_4_);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value);
    tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b4bc5e);
    section.m_log._4_4_ = section.m_log._4_4_ + 1;
  }
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_340,(char (*) [2])0x2b7dedb);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_340);
  programDefinition = (this->super_ResourceListTestCase).m_programDefinition;
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_ResourceListTestCase).super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  checkAndLogProgram((ShaderProgram *)local_e0,programDefinition,
                     (Functions *)CONCAT44(extraout_var,iVar2),pTVar5);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"ResourceList",&local_371)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,"Resource list",
             (allocator<char> *)
             ((long)&resourceList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  description = &local_398;
  tcu::ScopedLogSection::ScopedLogSection(&local_350,pTVar5,&local_370,description);
  interface = (ProgramInterface)description;
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&resourceList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&expectedResources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3d0);
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  ResourceListTestCase::queryResourceList
            (&this->super_ResourceListTestCase,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&expectedResources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,dVar3);
  getProgramInterfaceResourceList_abi_cxx11_
            (&local_3e8,(Functional *)(this->super_ResourceListTestCase).m_programDefinition,
             (Program *)(ulong)(this->super_ResourceListTestCase).m_programInterface,interface);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3d0,&local_3e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3e8);
  bVar1 = ResourceListTestCase::verifyResourceList
                    (&this->super_ResourceListTestCase,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&expectedResources.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_3d0);
  if (!bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"invalid resource list");
  }
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  bVar1 = ResourceListTestCase::verifyResourceIndexQuery
                    (&this->super_ResourceListTestCase,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&expectedResources.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_3d0,dVar3);
  if (!bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"GetProgramResourceIndex returned unexpected values");
  }
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  bVar1 = ResourceListTestCase::verifyMaxNameLength
                    (&this->super_ResourceListTestCase,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&expectedResources.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,dVar3);
  if (!bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"MAX_NAME_LENGTH invalid");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&expectedResources.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::ScopedLogSection::~ScopedLogSection(&local_350);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return STOP;
}

Assistant:

FeedbackResourceListTestCase::IterateResult FeedbackResourceListTestCase::iterate (void)
{
	const glu::ShaderProgram program(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_programDefinition));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Feedback varyings
	{
		tcu::MessageBuilder builder(&m_testCtx.getLog());
		builder << "Transform feedback varyings: {";
		for (int ndx = 0; ndx < (int)m_programDefinition->getTransformFeedbackVaryings().size(); ++ndx)
		{
			if (ndx)
				builder << ", ";
			builder << "\"" << m_programDefinition->getTransformFeedbackVaryings()[ndx] << "\"";
		}
		builder << "}" << tcu::TestLog::EndMessage;
	}

	checkAndLogProgram(program, m_programDefinition, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// Check resource list
	{
		const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "ResourceList", "Resource list");
		std::vector<std::string>	resourceList;
		std::vector<std::string>	expectedResources;

		queryResourceList(resourceList, program.getProgram());
		expectedResources = getProgramInterfaceResourceList(m_programDefinition, m_programInterface);

		// verify the list and the expected list match

		if (!verifyResourceList(resourceList, expectedResources))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid resource list");

		// verify GetProgramResourceIndex() matches the indices of the list

		if (!verifyResourceIndexQuery(resourceList, expectedResources, program.getProgram()))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "GetProgramResourceIndex returned unexpected values");

		// Verify MAX_NAME_LENGTH
		if (!verifyMaxNameLength(resourceList, program.getProgram()))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "MAX_NAME_LENGTH invalid");
	}

	return STOP;
}